

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void LargeIntRegMultiply<int,_unsigned_long>::
     RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int32_t a,uint64_t *b,int32_t *pRet)

{
  ulong uVar1;
  
  uVar1 = *b;
  *pRet = 0;
  if (a == 0 || uVar1 >> 0x20 == 0) {
    if (a < 0) {
      uVar1 = (uVar1 & 0xffffffff) * (ulong)(uint)-a;
      if (uVar1 < 0x80000001) {
        uVar1 = (ulong)(uint)-(int)uVar1;
        goto LAB_0010c9eb;
      }
    }
    else {
      uVar1 = (uVar1 & 0xffffffff) * (ulong)(uint)a;
      if (uVar1 < 0x80000000) {
LAB_0010c9eb:
        *pRet = (int32_t)uVar1;
        return;
      }
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void RegMultiplyThrow( std::int32_t a, const std::uint64_t& b, std::int32_t* pRet ) SAFEINT_CPP_THROW
    {
        std::uint32_t bHigh = 0, bLow = 0;
        bool fIsNegative = false;

        // Consider that a*b can be broken up into:
        // (aHigh * 2^32 + aLow) * (bHigh * 2^32 + bLow)
        // => (aHigh * bHigh * 2^64) + (aLow * bHigh * 2^32) + (aHigh * bLow * 2^32) + (aLow * bLow)

        bHigh = (std::uint32_t)(b >> 32);
        bLow  = (std::uint32_t)b;

        *pRet = 0;

        if(bHigh != 0 && a != 0)
            E::SafeIntOnOverflow();

        if( a < 0 )
        {
            a = (std::int32_t)AbsValueHelper< std::int32_t, GetAbsMethod< std::int32_t >::method >::Abs(a);
            fIsNegative = true;
        }

        std::uint64_t tmp = (std::uint32_t)a * (std::uint64_t)bLow;

        if( !fIsNegative )
        {
            if( tmp <= (std::uint64_t)std::numeric_limits< std::int32_t >::max() )
            {
                *pRet = (std::int32_t)tmp;
                return;
            }
        }
        else
        {
            if( tmp <= (std::uint64_t)std::numeric_limits< std::int32_t >::max()+1 )
            {
                *pRet = SignedNegation< std::int32_t >::Value( tmp );
                return;
            }
        }

        E::SafeIntOnOverflow();
    }